

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O2

QString * __thiscall
KDReports::XmlParser::extractText
          (QString *__return_storage_ptr__,XmlParser *this,QDomElement *element,QString *pId,
          QAbstractItemModel *currentModel,int currentRow)

{
  char cVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  Node<QString,_QString> *pNVar4;
  QArrayDataPointer<char16_t> *pQVar5;
  QArrayDataPointer<char16_t> *pQVar6;
  QString id;
  const_iterator it;
  QModelIndex index;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> *local_60;
  QArrayDataPointer<char16_t> local_58;
  QAbstractItemModel *local_38;
  
  pQVar6 = &id.d;
  pQVar5 = &id.d;
  id.d.d = (Data *)0x0;
  id.d.ptr = L"id";
  id.d.size = 2;
  it.i = (piter)ZEXT816(0);
  local_60 = &__return_storage_ptr__->d;
  local_38 = currentModel;
  cVar1 = QDomElement::hasAttribute((QString *)element);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&id.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&it);
  if (cVar1 == '\0') {
    id.d.d = (Data *)0x0;
    id.d.ptr = L"model";
    id.d.size = 5;
    it.i = (piter)ZEXT816(0);
    cVar1 = QDomElement::hasAttribute((QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&id.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&it);
    if (cVar1 == '\0') goto LAB_001465f8;
    id.d.d = (Data *)0x0;
    id.d.ptr = L"model";
    id.d.size = 5;
    index.r = 0;
    index.c = 0;
    index.i = 0;
    index.m = (QAbstractItemModel *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QDomElement::attribute((QString *)&it,(QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&id.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
    pQVar3 = modelForKey((QString *)&it);
    if (pQVar3 != (QAbstractItemModel *)0x0) {
      if (currentRow < 0 || pQVar3 != local_38) {
        index.r = 0;
        index.c = 0;
        index.i = (quintptr)anon_var_dwarf_19d6ee;
        index.m = (QAbstractItemModel *)0x3;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_78.size = 0;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
        QDomElement::attribute((QString *)&id,(QString *)element);
        currentRow = QString::toInt(&id,(bool *)0x0,10);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&id.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      }
      index.r = 0;
      index.c = 0;
      index.i = (quintptr)anon_var_dwarf_19d70d;
      index.m = (QAbstractItemModel *)0x6;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      QDomElement::attribute((QString *)&id,(QString *)element);
      iVar2 = QString::toInt(&id,(bool *)0x0,10);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&id.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      id.d.d = (Data *)0xffffffffffffffff;
      id.d.ptr = (char16_t *)0x0;
      id.d.size = 0;
      (**(code **)(*(long *)pQVar3 + 0x60))(&index,pQVar3,currentRow,iVar2,&id);
      (**(code **)(*(long *)pQVar3 + 0x90))(&id,pQVar3,&index,0);
      pQVar5 = local_60;
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&id);
      pQVar6 = (QArrayDataPointer<char16_t> *)&it;
      goto LAB_001465e7;
    }
    pQVar5 = (QArrayDataPointer<char16_t> *)&it;
  }
  else {
    it.i = (piter)(ZEXT816(0x1542f6) << 0x40);
    index.r = 0;
    index.c = 0;
    index.i = 0;
    index.m = (QAbstractItemModel *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QDomElement::attribute((QString *)&id,(QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&it);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&index);
    QString::operator=(pId,(QString *)&id);
    it = QHash<QString,_QString>::find(&this->m_textValues,&id);
    if (it.i.d != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || it.i.bucket != 0) {
      pNVar4 = QHashPrivate::iterator<QHashPrivate::Node<QString,_QString>_>::node(&it.i);
      pQVar5 = local_60;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_60,&(pNVar4->value).d);
LAB_001465e7:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar6);
      return (QString *)pQVar5;
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar5);
LAB_001465f8:
  pQVar6 = local_60;
  QDomElement::text();
  return (QString *)pQVar6;
}

Assistant:

QString KDReports::XmlParser::extractText(const QDomElement &element, QString *pId, const QAbstractItemModel *currentModel, int currentRow) const
{
    if (element.hasAttribute(QStringLiteral("id"))) {
        const QString id = element.attribute(QStringLiteral("id"));
        *pId = id;
        const QHash<QString, QString>::const_iterator it = m_textValues.find(id);
        if (it != m_textValues.end()) {
            return *it;
        }
    } else if (element.hasAttribute(QStringLiteral("model"))) {
        const QString modelName = element.attribute(QStringLiteral("model"));
        QAbstractItemModel *model = KDReports::modelForKey(modelName);
        if (model) {
            int row;
            if (model == currentModel && currentRow > -1) {
                row = currentRow;
            } else {
                row = element.attribute(QStringLiteral("row")).toInt();
            }
            const int column = element.attribute(QStringLiteral("column")).toInt();
            const QModelIndex index = model->index(row, column);
            return model->data(index).toString();
        }
    }

    return element.text();
}